

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

aom_noise_tx_t * aom_noise_tx_malloc(int block_size)

{
  aom_noise_tx_t *paVar1;
  float *pfVar2;
  uint in_EDI;
  aom_noise_tx_t *noise_tx;
  undefined4 in_stack_fffffffffffffff0;
  size_t in_stack_fffffffffffffff8;
  
  paVar1 = (aom_noise_tx_t *)aom_malloc(0x3bd772);
  if (paVar1 == (aom_noise_tx_t *)0x0) {
    paVar1 = (aom_noise_tx_t *)0x0;
  }
  else {
    *(undefined8 *)&paVar1->block_size = 0;
    paVar1->fft = (_func_void_float_ptr_float_ptr_float_ptr *)0x0;
    paVar1->tx_block = (float *)0x0;
    paVar1->temp = (float *)0x0;
    paVar1->ifft = (_func_void_float_ptr_float_ptr_float_ptr *)0x0;
    switch((void *)(ulong)(in_EDI - 2)) {
    case (void *)0x0:
      paVar1->fft = aom_fft2x2_float_c;
      paVar1->ifft = aom_ifft2x2_float_c;
      break;
    default:
      aom_free((void *)(ulong)(in_EDI - 2));
      fprintf(_stderr,"Unsupported block size %d\n",(ulong)in_EDI);
      return (aom_noise_tx_t *)0x0;
    case (void *)0x2:
      paVar1->fft = aom_fft4x4_float_sse2;
      paVar1->ifft = aom_ifft4x4_float_sse2;
      break;
    case (void *)0x6:
      paVar1->fft = aom_fft8x8_float;
      paVar1->ifft = aom_ifft8x8_float;
      break;
    case (void *)0xe:
      paVar1->fft = aom_fft16x16_float;
      paVar1->ifft = aom_ifft16x16_float;
      break;
    case (void *)0x1e:
      paVar1->fft = aom_fft32x32_float;
      paVar1->ifft = aom_ifft32x32_float;
    }
    paVar1->block_size = in_EDI;
    pfVar2 = (float *)aom_memalign(in_stack_fffffffffffffff8,
                                   CONCAT44(in_EDI,in_stack_fffffffffffffff0));
    paVar1->tx_block = pfVar2;
    pfVar2 = (float *)aom_memalign(in_stack_fffffffffffffff8,
                                   CONCAT44(in_EDI,in_stack_fffffffffffffff0));
    paVar1->temp = pfVar2;
    if ((paVar1->tx_block == (float *)0x0) || (paVar1->temp == (float *)0x0)) {
      aom_noise_tx_free((aom_noise_tx_t *)0x3bd945);
      paVar1 = (aom_noise_tx_t *)0x0;
    }
    else {
      memset(paVar1->tx_block,0,(long)(int)in_EDI * 8 * (long)(int)in_EDI);
      memset(paVar1->temp,0,(long)(int)in_EDI * 8 * (long)(int)in_EDI);
    }
  }
  return paVar1;
}

Assistant:

struct aom_noise_tx_t *aom_noise_tx_malloc(int block_size) {
  struct aom_noise_tx_t *noise_tx =
      (struct aom_noise_tx_t *)aom_malloc(sizeof(struct aom_noise_tx_t));
  if (!noise_tx) return NULL;
  memset(noise_tx, 0, sizeof(*noise_tx));
  switch (block_size) {
    case 2:
      noise_tx->fft = aom_fft2x2_float;
      noise_tx->ifft = aom_ifft2x2_float;
      break;
    case 4:
      noise_tx->fft = aom_fft4x4_float;
      noise_tx->ifft = aom_ifft4x4_float;
      break;
    case 8:
      noise_tx->fft = aom_fft8x8_float;
      noise_tx->ifft = aom_ifft8x8_float;
      break;
    case 16:
      noise_tx->fft = aom_fft16x16_float;
      noise_tx->ifft = aom_ifft16x16_float;
      break;
    case 32:
      noise_tx->fft = aom_fft32x32_float;
      noise_tx->ifft = aom_ifft32x32_float;
      break;
    default:
      aom_free(noise_tx);
      fprintf(stderr, "Unsupported block size %d\n", block_size);
      return NULL;
  }
  noise_tx->block_size = block_size;
  noise_tx->tx_block = (float *)aom_memalign(
      32, 2 * sizeof(*noise_tx->tx_block) * block_size * block_size);
  noise_tx->temp = (float *)aom_memalign(
      32, 2 * sizeof(*noise_tx->temp) * block_size * block_size);
  if (!noise_tx->tx_block || !noise_tx->temp) {
    aom_noise_tx_free(noise_tx);
    return NULL;
  }
  // Clear the buffers up front. Some outputs of the forward transform are
  // real only (the imaginary component will never be touched)
  memset(noise_tx->tx_block, 0,
         2 * sizeof(*noise_tx->tx_block) * block_size * block_size);
  memset(noise_tx->temp, 0,
         2 * sizeof(*noise_tx->temp) * block_size * block_size);
  return noise_tx;
}